

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverVI.cpp
# Opt level: O2

void __thiscall chrono::ChIterativeSolverVI::ArchiveOUT(ChIterativeSolverVI *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChIterativeSolverVI *)&this[-1].dlambda_history,in_RSI);
  return;
}

Assistant:

void ChIterativeSolverVI::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChIterativeSolverVI>();
    // serialize parent class
    ChSolver::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(m_max_iterations);
    marchive << CHNVP(m_warm_start);
    marchive << CHNVP(m_tolerance);
    marchive << CHNVP(m_omega);
    marchive << CHNVP(m_shlambda);
}